

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall
gvr::PLYReader::getComments
          (PLYReader *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *clist)

{
  pointer ppPVar1;
  ulong uVar2;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(clist);
  ppPVar1 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppPVar1) {
    uVar2 = 0;
    do {
      if (ppPVar1[uVar2]->size < 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(clist,&ppPVar1[uVar2]->name);
      }
      uVar2 = uVar2 + 1;
      ppPVar1 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->list).
                                   super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void PLYReader::getComments(std::vector<std::string> &clist) const
{
  clist.clear();

  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getInstances() < 0)
    {
      clist.push_back(list[i]->getName());
    }
  }
}